

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O3

void displayLimitCycleInfo
               (ostream *o,PolynomialFDS *pds,
               vector<ComponentData,_std::allocator<ComponentData>_> *cycleinfo)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  pointer pCVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  State u;
  vector<int,_std::allocator<int>_> local_68;
  allocator_type local_49;
  vector<ComponentData,_std::allocator<ComponentData>_> *local_48;
  ulong local_40;
  value_type_conflict local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Number of cycles (components): ",0x1f);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  uVar1 = pds->mNumStates;
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_68,
             (long)(int)((ulong)((long)(pds->mPolynomials).
                                       super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pds->mPolynomials).
                                      super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 6),&local_34,
             &local_49);
  pCVar6 = (cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = cycleinfo;
  if ((cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar6) {
    uVar10 = 0;
    do {
      lVar12 = (long)pCVar6[uVar10].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)pCVar6[uVar10].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>(o,"COMPONENT #",0xb);
      uVar8 = uVar10 + 1;
      poVar4 = std::ostream::_M_insert<long>((long)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(o,"  component size: ",0x12);
      poVar4 = std::ostream::_M_insert<long>((long)o);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      cVar2 = (char)o;
      if (lVar12 == 8) {
        uVar3 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) - 1;
        if (-1 < (int)uVar3) {
          lVar12 = **(long **)&(local_48->
                               super__Vector_base<ComponentData,_std::allocator<ComponentData>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar10].limitCycle.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl;
          uVar10 = (ulong)uVar3;
          uVar11 = (ulong)uVar1;
          do {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10] = (int)(lVar12 % (long)(int)uVar11);
            uVar11 = (ulong)(int)uVar1;
            lVar12 = lVar12 / (long)uVar11;
            bVar13 = uVar10 != 0;
            uVar10 = uVar10 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"  fixed point: [",0x10);
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar10 = 0;
          do {
            if (uVar10 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
            }
            std::ostream::operator<<
                      (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
        std::ostream::put(cVar2);
        plVar5 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"  cycle of length ",0x12);
        lVar12 = lVar12 >> 3;
        poVar4 = std::ostream::_M_insert<long>((long)o);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        local_40 = uVar8;
        if (0 < lVar12) {
          lVar9 = 0;
          do {
            uVar3 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
            if (-1 < (int)uVar3) {
              lVar7 = *(long *)(*(long *)&(local_48->
                                          super__Vector_base<ComponentData,_std::allocator<ComponentData>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                          limitCycle.super__Vector_base<long,_std::allocator<long>_>
                                          ._M_impl + lVar9 * 8);
              uVar8 = (ulong)uVar3;
              uVar11 = (ulong)uVar1;
              do {
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] = (int)(lVar7 % (long)(int)uVar11);
                uVar11 = (ulong)(int)uVar1;
                lVar7 = lVar7 / (long)uVar11;
                bVar13 = uVar8 != 0;
                uVar8 = uVar8 - 1;
              } while (bVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>(o,"    [",5);
            if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar8 = 0;
              do {
                if (uVar8 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
                }
                std::ostream::operator<<
                          (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8]);
                uVar8 = uVar8 + 1;
              } while (uVar8 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 2));
            }
            std::__ostream_insert<char,std::char_traits<char>>(o,"] -> ",5);
            std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar12);
        }
        uVar3 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) - 1;
        if (-1 < (int)uVar3) {
          lVar12 = **(long **)&(local_48->
                               super__Vector_base<ComponentData,_std::allocator<ComponentData>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar10].limitCycle.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl;
          uVar10 = (ulong)uVar3;
          uVar8 = (ulong)uVar1;
          do {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10] = (int)(lVar12 % (long)(int)uVar8);
            uVar8 = (ulong)(int)uVar1;
            lVar12 = lVar12 / (long)uVar8;
            bVar13 = uVar10 != 0;
            uVar10 = uVar10 - 1;
          } while (bVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"    [",5);
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar10 = 0;
          do {
            if (uVar10 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
            }
            std::ostream::operator<<
                      (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
        uVar8 = local_40;
        std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar2);
        std::ostream::put(cVar2);
        plVar5 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      }
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      pCVar6 = (local_48->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar10 = uVar8;
    } while (uVar8 < (ulong)((long)(local_48->
                                   super__Vector_base<ComponentData,_std::allocator<ComponentData>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6 >> 5))
    ;
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void displayLimitCycleInfo(std::ostream& o,
                           const PolynomialFDS& pds,
                           const std::vector<ComponentData>& cycleinfo)
{
  o << "Number of cycles (components): " << cycleinfo.size() << std::endl << std::endl;
  State u(pds.numStates(), pds.numVariables());  
  for (long i=0; i<cycleinfo.size(); i++)
    {
      long cyclelen = cycleinfo[i].limitCycle.size();
      o << "COMPONENT #" << i+1 << ":" << std::endl;
      o << "  component size: " << cycleinfo[i].componentSize << std::endl;
      if (cyclelen == 1)
        {
          u.setFromIndex(cycleinfo[i].limitCycle[0]);
          o << "  fixed point: [" << u << "]" << std::endl << std::endl;
        }
      else {
        o << "  cycle of length " << cyclelen << ": " << std::endl;
        for (int j=0; j<cyclelen; j++)
          {
            u.setFromIndex(cycleinfo[i].limitCycle[j]);
            o << "    [" << u << "] -> " << std::endl;
          }
        u.setFromIndex(cycleinfo[i].limitCycle[0]);
        o << "    [" << u << "]" << std::endl << std::endl;
      }
    }
}